

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DrawSpecs.hpp
# Opt level: O3

void __thiscall sciplot::DrawSpecs::DrawSpecs(DrawSpecs *this,string *what,string *use,string *with)

{
  pointer pcVar1;
  
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linestyle._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linestyle.field_2;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linestyle._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linestyle.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linetype._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linetype.field_2;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linetype._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linetype.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linewidth._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linewidth.field_2;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linewidth._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linewidth.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linecolor._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linecolor.field_2;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linecolor._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_linecolor.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_dashtype._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::DrawSpecs>).m_dashtype.field_2;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_dashtype._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::DrawSpecs>).m_dashtype.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&this->super_PointSpecsOf<sciplot::DrawSpecs> = 0x1a49e0;
  *(undefined8 *)&this->super_LineSpecsOf<sciplot::DrawSpecs> = 0x1a4a18;
  (this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointtype._M_dataplus._M_p =
       (pointer)&(this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointtype.field_2;
  (this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointtype._M_string_length = 0;
  (this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointtype.field_2._M_local_buf[0] = '\0';
  (this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointsize._M_dataplus._M_p =
       (pointer)&(this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointsize.field_2;
  (this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointsize._M_string_length = 0;
  (this->super_PointSpecsOf<sciplot::DrawSpecs>).m_pointsize.field_2._M_local_buf[0] = '\0';
  FillSpecsOf<sciplot::DrawSpecs>::FillSpecsOf
            (&this->super_FillSpecsOf<sciplot::DrawSpecs>,&PTR_construction_vtable_40__001a4918);
  *(undefined ***)&this->super_LineSpecsOf<sciplot::DrawSpecs> = &PTR__DrawSpecs_001a4858;
  *(undefined ***)&this->super_PointSpecsOf<sciplot::DrawSpecs> = &PTR__DrawSpecs_001a4898;
  *(undefined ***)&this->super_FillSpecsOf<sciplot::DrawSpecs> = &PTR__DrawSpecs_001a48d8;
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  pcVar1 = (what->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_what,pcVar1,pcVar1 + what->_M_string_length);
  (this->m_using)._M_dataplus._M_p = (pointer)&(this->m_using).field_2;
  pcVar1 = (use->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_using,pcVar1,pcVar1 + use->_M_string_length);
  (this->m_with)._M_dataplus._M_p = (pointer)&(this->m_with).field_2;
  pcVar1 = (with->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_with,pcVar1,pcVar1 + with->_M_string_length);
  (this->m_title)._M_dataplus._M_p = (pointer)&(this->m_title).field_2;
  (this->m_title)._M_string_length = 0;
  (this->m_title).field_2._M_local_buf[0] = '\0';
  (this->m_xtic)._M_dataplus._M_p = (pointer)&(this->m_xtic).field_2;
  (this->m_xtic)._M_string_length = 0;
  (this->m_xtic).field_2._M_local_buf[0] = '\0';
  (this->m_ytic)._M_dataplus._M_p = (pointer)&(this->m_ytic).field_2;
  (this->m_ytic)._M_string_length = 0;
  (this->m_ytic).field_2._M_local_buf[0] = '\0';
  LineSpecsOf<sciplot::DrawSpecs>::lineWidth(&this->super_LineSpecsOf<sciplot::DrawSpecs>,2);
  return;
}

Assistant:

inline DrawSpecs::DrawSpecs(std::string what, std::string use, std::string with)
: m_what(what), m_using(use), m_with(with)
{
    lineWidth(internal::DEFAULT_LINEWIDTH);
}